

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int uripRead(void *context,char *buffer,int len)

{
  char *ptr;
  int len_local;
  char *buffer_local;
  void *context_local;
  
  if (((context == (void *)0x0) || (buffer == (char *)0x0)) || (len < 0)) {
    context_local._4_4_ = -1;
  }
  else {
    ptr._4_4_ = len;
    if (urip_rlen < len) {
      ptr._4_4_ = urip_rlen;
    }
    memcpy(buffer,context,(long)ptr._4_4_);
    urip_rlen = urip_rlen - ptr._4_4_;
    context_local._4_4_ = ptr._4_4_;
  }
  return context_local._4_4_;
}

Assistant:

static int
uripRead(void * context, char * buffer, int len) {
   const char *ptr = (const char *) context;

   if ((context == NULL) || (buffer == NULL) || (len < 0))
       return(-1);

   if (len > urip_rlen) len = urip_rlen;
   memcpy(buffer, ptr, len);
   urip_rlen -= len;
   return(len);
}